

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int sasl_challenge_get_challenge(SASL_CHALLENGE_HANDLE sasl_challenge,amqp_binary *challenge_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int get_single_value_result;
  AMQP_VALUE item_value;
  SASL_CHALLENGE_INSTANCE *sasl_challenge_instance;
  uint32_t item_count;
  int result;
  amqp_binary *challenge_value_local;
  SASL_CHALLENGE_HANDLE sasl_challenge_local;
  
  if (sasl_challenge == (SASL_CHALLENGE_HANDLE)0x0) {
    sasl_challenge_instance._4_4_ = 0x2b9e;
  }
  else {
    _item_count = challenge_value;
    challenge_value_local = (amqp_binary *)sasl_challenge;
    iVar1 = amqpvalue_get_composite_item_count
                      (sasl_challenge->composite_value,(uint32_t *)&sasl_challenge_instance);
    if (iVar1 == 0) {
      if ((int)sasl_challenge_instance == 0) {
        sasl_challenge_instance._4_4_ = 0x2bac;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(sasl_challenge->composite_value,0);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          sasl_challenge_instance._4_4_ = 0x2bb4;
        }
        else {
          iVar1 = amqpvalue_get_binary(value,_item_count);
          if (iVar1 == 0) {
            sasl_challenge_instance._4_4_ = 0;
          }
          else {
            sasl_challenge_instance._4_4_ = 0x2bbb;
          }
        }
      }
    }
    else {
      sasl_challenge_instance._4_4_ = 0x2ba6;
    }
  }
  return sasl_challenge_instance._4_4_;
}

Assistant:

int sasl_challenge_get_challenge(SASL_CHALLENGE_HANDLE sasl_challenge, amqp_binary* challenge_value)
{
    int result;

    if (sasl_challenge == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        SASL_CHALLENGE_INSTANCE* sasl_challenge_instance = (SASL_CHALLENGE_INSTANCE*)sasl_challenge;
        if (amqpvalue_get_composite_item_count(sasl_challenge_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(sasl_challenge_instance->composite_value, 0);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_binary(item_value, challenge_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}